

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O3

level_conflict * level_by_name(level_map_conflict *map,char *name)

{
  int iVar1;
  char *__s2;
  long lVar2;
  long lVar3;
  level_conflict *lev;
  
  if (0 < map->num_levels) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      lev = (level_conflict *)((long)&map->levels->index + lVar2);
      __s2 = level_name(lev);
      iVar1 = strcmp(name,__s2);
      if (iVar1 == 0) {
        return lev;
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x50;
    } while (lVar3 < map->num_levels);
  }
  return (level_conflict *)0x0;
}

Assistant:

struct level *level_by_name(struct level_map *map, const char *name)
{
	int i;
	for (i = 0; i < map->num_levels; i++) {
		struct level *lev = &map->levels[i];
		if (streq(name, level_name(lev))) {
			return lev;
		}
	}
	return NULL;
}